

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::source_filename_formatter<spdlog::details::scoped_padder>::format
          (source_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *__s;
  size_t sVar1;
  char *buf_ptr;
  scoped_padder p;
  scoped_padder local_40;
  
  if ((msg->source).line != 0) {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar1 = strlen((msg->source).filename);
    }
    else {
      sVar1 = 0;
    }
    scoped_padder::scoped_padder(&local_40,sVar1,&(this->super_flag_formatter).padinfo_,dest);
    __s = (msg->source).filename;
    sVar1 = strlen(__s);
    fmt::v8::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar1);
    scoped_padder::~scoped_padder(&local_40);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }